

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

int64_t wallet::GetOldestKeyTimeInPool
                  (set<long,_std::less<long>,_std::allocator<long>_> *setKeyPool,WalletBatch *batch)

{
  bool bVar1;
  int64_t iVar2;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long in_FS_OFFSET;
  CKeyPool keypool;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  size_type *local_a0;
  size_type local_98;
  size_type local_90;
  undefined8 uStack_88;
  CKeyPool local_80;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((setKeyPool->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      iVar2 = GetTime();
      return iVar2;
    }
  }
  else {
    CKeyPool::CKeyPool(&local_80);
    bVar1 = WalletBatch::ReadPool
                      (batch,*(int64_t *)
                              ((setKeyPool->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left +
                              1),&local_80);
    if (bVar1) {
      if ((((local_80.vchPubKey.vch[0] & 0xfe) != 2) && (1 < local_80.vchPubKey.vch[0] - 6)) &&
         (local_80.vchPubKey.vch[0] != 4)) {
        __assert_fail("keypool.vchPubKey.IsValid()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                      ,0x225,
                      "int64_t wallet::GetOldestKeyTimeInPool(const std::set<int64_t> &, WalletBatch &)"
                     );
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return local_80.nTime;
      }
    }
    else {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"GetOldestKeyTimeInPool","");
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_c0,": read oldest key in keypool failed");
      local_a0 = (size_type *)(pbVar3->_M_dataplus)._M_p;
      paVar4 = &pbVar3->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0 == paVar4) {
        local_90 = paVar4->_M_allocated_capacity;
        uStack_88 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        local_a0 = &local_90;
      }
      else {
        local_90 = paVar4->_M_allocated_capacity;
      }
      local_98 = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      std::runtime_error::runtime_error(this,(string *)&local_a0);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

static int64_t GetOldestKeyTimeInPool(const std::set<int64_t>& setKeyPool, WalletBatch& batch) {
    if (setKeyPool.empty()) {
        return GetTime();
    }

    CKeyPool keypool;
    int64_t nIndex = *(setKeyPool.begin());
    if (!batch.ReadPool(nIndex, keypool)) {
        throw std::runtime_error(std::string(__func__) + ": read oldest key in keypool failed");
    }
    assert(keypool.vchPubKey.IsValid());
    return keypool.nTime;
}